

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

bool __thiscall APowerup::HandlePickup(APowerup *this,AInventory *item)

{
  MetaClass *pMVar1;
  MetaClass *pMVar2;
  APowerup *power;
  AInventory *item_local;
  APowerup *this_local;
  
  pMVar1 = AInventory::GetClass(item);
  pMVar2 = AInventory::GetClass(&this->super_AInventory);
  if (pMVar1 == pMVar2) {
    if (*(int *)&item->field_0x4fc == 0) {
      item->ItemFlags = item->ItemFlags | 4;
      this_local._7_1_ = true;
    }
    else {
      if ((item->ItemFlags & 0x200) == 0) {
        if ((0x80 < *(int *)&(this->super_AInventory).field_0x4fc) &&
           ((item->ItemFlags & 0x400) == 0)) {
          return true;
        }
        if (*(int *)&(this->super_AInventory).field_0x4fc < *(int *)&item->field_0x4fc) {
          *(undefined4 *)&(this->super_AInventory).field_0x4fc = *(undefined4 *)&item->field_0x4fc;
          (this->BlendColor).field_0 = *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
        }
      }
      else {
        *(int *)&(this->super_AInventory).field_0x4fc =
             *(int *)&item->field_0x4fc + *(int *)&(this->super_AInventory).field_0x4fc;
        (this->BlendColor).field_0 = *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
      }
      item->ItemFlags = item->ItemFlags | 4;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool APowerup::HandlePickup (AInventory *item)
{
	if (item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup*>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Color gets transferred if the new item has an effect.

		// Increase the effect's duration.
		if (power->ItemFlags & IF_ADDITIVETIME) 
		{
			EffectTics += power->EffectTics;
			BlendColor = power->BlendColor;
		}
		// If it's not blinking yet, you can't replenish the power unless the
		// powerup is required to be picked up.
		else if (EffectTics > BLINKTHRESHOLD && !(power->ItemFlags & IF_ALWAYSPICKUP))
		{
			return true;
		}
		// Reset the effect duration.
		else if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return false;
}